

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O2

void __thiscall inequation_Square7_Test::TestBody(inequation_Square7_Test *this)

{
  char *message;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  ExprPtr EVar1;
  AssertionResult gtest_ar;
  ExprPtr local_a8;
  ExprPtr e;
  string local_88;
  ExprPtr local_68;
  ExprPtr e2;
  ExprPtr local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  ExprPtr local_28;
  ExprPtr e1;
  
  mathiu::impl::operator____s((char *)&e2,0x1ccabb);
  mathiu::impl::integer(gtest_ar._4_4_);
  mathiu::impl::pow((impl *)&local_88,__x,in_XMM1_Qa);
  mathiu::impl::integer(gtest_ar._4_4_);
  mathiu::impl::operator-((impl *)&e1,(ExprPtr *)&local_88,(ExprPtr *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  mathiu::impl::integer(gtest_ar._4_4_);
  mathiu::impl::operator____s((char *)&local_68,0x1ccabb);
  mathiu::impl::integer(gtest_ar._4_4_);
  mathiu::impl::operator-((impl *)&local_a8,&local_68,&local_28);
  mathiu::impl::operator*((impl *)&e,(ExprPtr *)&gtest_ar,&local_a8);
  mathiu::impl::integer(gtest_ar._4_4_);
  mathiu::impl::pow((impl *)&local_88,__x_00,in_XMM1_Qa);
  mathiu::impl::integer(gtest_ar._4_4_);
  mathiu::impl::operator-((impl *)&e2,(ExprPtr *)&local_88,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  mathiu::impl::operator>((impl *)&e,&e1,&e2);
  mathiu::impl::operator____s((char *)&local_68,0x1ccabb);
  EVar1 = mathiu::impl::solveInequation
                    ((impl *)&local_a8,&e,&local_68,(ExprPtr *)mathiu::impl::true_);
  mathiu::impl::toString_abi_cxx11_
            (&local_88,(impl *)&local_a8,
             (ExprPtr *)
             EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[78]>
            ((internal *)&gtest_ar,"toString(solveInequation(e, \"x\"_s))",
             "\"(OOInterval (* 1/-6 (+ -24 (* -1 (^ 168 1/2)))) (* 1/-6 (+ -24 (^ 168 1/2))))\"",
             &local_88,
             (char (*) [78])
             "(OOInterval (* 1/-6 (+ -24 (* -1 (^ 168 1/2)))) (* 1/-6 (+ -24 (^ 168 1/2))))");
  std::__cxx11::string::~string((string *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0x77,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(inequation, Square7)
{
    auto const e1 = ("x"_s ^ 2_i) - 1_i;
    auto const e2 = (2_i*("x"_s - 3_i) ^ 2_i) - 3_i;;
    auto const e = e1 > e2;
    EXPECT_EQ(toString(solveInequation(e, "x"_s)), "(OOInterval (* 1/-6 (+ -24 (* -1 (^ 168 1/2)))) (* 1/-6 (+ -24 (^ 168 1/2))))");
}